

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall
CaDiCaL::LratChecker::weaken_minus
          (LratChecker *this,uint64_t id,vector<int,_std::allocator<int>_> *c)

{
  bool bVar1;
  char *pcVar2;
  uint *puVar3;
  iterator __first;
  iterator this_00;
  pointer in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> e;
  int *lit_4;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  int *lit_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int *lit_2;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int lit_1;
  uint i;
  int *dp;
  int *lit;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  LratCheckerClause *d;
  LratCheckerClause **p;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  LratChecker *in_stack_fffffffffffffef0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  LratChecker *in_stack_ffffffffffffff10;
  int local_d0 [2];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  reference local_98;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  vector<int,_std::allocator<int>_> *local_60;
  int local_58;
  uint local_54;
  int *local_50;
  reference local_48;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  vector<int,_std::allocator<int>_> *local_30;
  LratCheckerClause *local_28;
  LratCheckerClause **local_20;
  pointer local_10;
  
  local_10 = in_RSI;
  import_clause(in_stack_ffffffffffffff10,in_RDI);
  in_RDI[0xd].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_10;
  local_20 = find(in_stack_ffffffffffffff10,(uint64_t)in_RDI);
  local_28 = *local_20;
  if (local_28 == (LratCheckerClause *)0x0) {
    fatal_message_start();
    fputs("weakened clause not in proof:\n",_stderr);
    local_a0 = in_RDI + 10;
    local_a8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8);
    std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffef0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffee8), bVar1) {
      puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_a8);
      fprintf(_stderr,"%d ",(ulong)*puVar3);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_a8);
    }
    fputc(0x30,_stderr);
    fatal_message_end();
  }
  else {
    local_30 = in_RDI + 10;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8);
    local_40 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffef0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffee8), bVar1) {
      local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_38);
      pcVar2 = mark(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      *pcVar2 = '\x01';
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
    local_50 = local_28->literals;
    for (local_54 = 0; local_54 < local_28->size; local_54 = local_54 + 1) {
      local_58 = local_50[local_54];
      pcVar2 = mark(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      if (*pcVar2 == '\0') {
        fatal_message_start();
        fputs("deleted clause not in proof:\n",_stderr);
        local_60 = in_RDI + 10;
        local_68._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8);
        in_stack_ffffffffffffff90 =
             std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffee8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffef0,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffee8), bVar1) {
          in_stack_ffffffffffffff88 =
               (vector<int,_std::allocator<int>_> *)
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_68);
          fprintf(_stderr,"%d ",
                  (ulong)*(uint *)&(in_stack_ffffffffffffff88->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_68);
        }
        fputc(0x30,_stderr);
        fatal_message_end();
      }
    }
    local_80 = in_RDI + 10;
    local_88._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffee8);
    local_90 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffef0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffee8), bVar1) {
      local_98 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_88);
      pcVar2 = mark(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      *pcVar2 = '\0';
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_88);
    }
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xdcce7c);
  __last._M_current = local_d0;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  __first = std::begin<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffee8);
  this_00 = std::end<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffee8);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             __last);
  std::
  unordered_map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator[]((unordered_map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)this_00._M_current,(key_type *)in_stack_fffffffffffffee8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90._M_current,
             in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)__first._M_current);
  return;
}

Assistant:

void LratChecker::weaken_minus (uint64_t id, const vector<int> &c) {
  LOG (c, "LRAT CHECKER saving clause[%" PRIu64 "] to restore later", id);
  import_clause (c);

  assert (id <= current_id);
  last_id = id;
  LratCheckerClause **p = find (id), *d = *p;
  if (d) {
    for (const auto &lit : imported_clause)
      mark (lit) = true;
    const int *dp = d->literals;
    for (unsigned i = 0; i < d->size; i++) {
      int lit = *(dp + i);
      if (!mark (lit)) {        // should never happen since ids
        fatal_message_start (); // are unique.
        fputs ("deleted clause not in proof:\n", stderr);
        for (const auto &lit : imported_clause)
          fprintf (stderr, "%d ", lit);
        fputc ('0', stderr);
        fatal_message_end ();
      }
    }
    for (const auto &lit : imported_clause)
      mark (lit) = false;
  } else {
    fatal_message_start ();
    fputs ("weakened clause not in proof:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  }
  imported_clause.clear ();

  vector<int> e = c;
  sort (begin (e), end (e));
  clauses_to_reconstruct[id] = e;
}